

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

int FBaseCVar::ToInt(UCVarValue value,ECVarType type)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  switch(type) {
  case CVAR_Bool:
    value._0_4_ = (uint)value.Float & 1;
    value._4_4_ = 0;
  case CVAR_Int:
    iVar3 = value.Int;
    break;
  case CVAR_Float:
    iVar3 = (int)value.Float;
    break;
  case CVAR_String:
    iVar1 = strcasecmp(value.String,"true");
    if (iVar1 == 0) {
      iVar3 = 1;
    }
    else {
      iVar1 = strcasecmp(value.String,"false");
      if (iVar1 != 0) {
        lVar2 = strtol(value.String,(char **)0x0,0);
        iVar3 = (int)lVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int FBaseCVar::ToInt (UCVarValue value, ECVarType type)
{
	int res;
#if __GNUC__ <= 2
	float tmp;
#endif

	switch (type)
	{
	case CVAR_Bool:			res = (int)value.Bool; break;
	case CVAR_Int:			res = value.Int; break;
#if __GNUC__ <= 2
	case CVAR_Float:		tmp = value.Float; res = (int)tmp; break;
#else
	case CVAR_Float:		res = (int)value.Float; break;
#endif
	case CVAR_String:		
		{
			if (stricmp (value.String, "true") == 0)
				res = 1;
			else if (stricmp (value.String, "false") == 0)
				res = 0;
			else
				res = strtol (value.String, NULL, 0); 
			break;
		}
	case CVAR_GUID:			res = 0; break;
	default:				res = 0; break;
	}
	return res;
}